

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

matches * atomctarg(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  uint uVar1;
  int iVar2;
  matches *pmVar3;
  expr *peVar4;
  ull uVar5;
  expr **ppeVar6;
  char *pcVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  
  if (ctx->reverse != 0) {
    pmVar3 = matchimm(ctx,(bitfield *)v,spos);
    return pmVar3;
  }
  peVar4 = (expr *)calloc(0x48,1);
  peVar4->type = EXPR_NUM;
  uVar5 = getbf((bitfield *)v,a,m,ctx);
  peVar4->num1 = uVar5;
  uVar1 = ctx->codebase;
  uVar8 = (uint)uVar5;
  if ((uVar1 <= uVar8) && (uVar8 < ctx->codesz / (uint)ctx->isa->posunit + uVar1)) {
    ctx->marks[uVar8 - uVar1] = ctx->marks[uVar8 - uVar1] | 2;
  }
  uVar1 = ctx->codebase;
  if (((uVar1 <= uVar8) && (uVar8 < ctx->codesz / (uint)ctx->isa->posunit + uVar1)) &&
     ((*(byte *)(ctx->marks + (uVar8 - uVar1)) & 0x40) != 0)) {
    ctx->endmark = 1;
  }
  peVar4->special = 2;
  iVar2 = ctx->atomsmax;
  if (iVar2 <= ctx->atomsnum) {
    iVar9 = 0x10;
    if (iVar2 != 0) {
      iVar9 = iVar2 * 2;
    }
    ctx->atomsmax = iVar9;
    ppeVar6 = (expr **)realloc(ctx->atoms,(long)iVar9 << 3);
    ctx->atoms = ppeVar6;
  }
  iVar2 = ctx->atomsnum;
  iVar9 = iVar2 + 1;
  ctx->atomsnum = iVar9;
  ctx->atoms[iVar2] = peVar4;
  if (0 < (long)ctx->labelsnum) {
    lVar10 = 0;
    do {
      if ((*(ull *)((long)&ctx->labels->val + lVar10) == peVar4->num1) &&
         (pcVar7 = *(char **)((long)&ctx->labels->name + lVar10), pcVar7 != (char *)0x0)) {
        peVar4 = (expr *)calloc(0x48,1);
        peVar4->type = EXPR_LABEL;
        pcVar7 = strdup(pcVar7);
        peVar4->str = pcVar7;
        peVar4->special = 2;
        iVar2 = ctx->atomsmax;
        if (iVar2 <= iVar9) {
          iVar9 = 0x10;
          if (iVar2 != 0) {
            iVar9 = iVar2 * 2;
          }
          ctx->atomsmax = iVar9;
          ppeVar6 = (expr **)realloc(ctx->atoms,(long)iVar9 << 3);
          ctx->atoms = ppeVar6;
        }
        iVar2 = ctx->atomsnum;
        ctx->atomsnum = iVar2 + 1;
        ctx->atoms[iVar2] = peVar4;
        return (matches *)0x0;
      }
      lVar10 = lVar10 + 0x18;
    } while ((long)ctx->labelsnum * 0x18 != lVar10);
  }
  return (matches *)0x0;
}

Assistant:

struct matches *atomctarg APROTO {
	const struct bitfield *bf = v;
	if (ctx->reverse)
		return matchimm(ctx, bf, spos);
	struct expr *expr = makeex(EXPR_NUM);
	expr->num1 = GETBF(bf);
	mark(ctx, expr->num1, 2);
	if (is_nr_mark(ctx, expr->num1))
		ctx->endmark = 1;
	expr->special = 2;
	ADDARRAY(ctx->atoms, expr);
	int i;
	for (i = 0; i < ctx->labelsnum; i++) {
		if (ctx->labels[i].val == expr->num1 && ctx->labels[i].name) {
			struct expr *expr = makeex(EXPR_LABEL);
			expr->str = strdup(ctx->labels[i].name);
			expr->special = 2;
			ADDARRAY(ctx->atoms, expr);
			return NULL;
		}
	}
	return NULL;
}